

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O1

int tlstran_ep_init_dialer(void *arg,nng_url *url,nni_dialer *ndialer)

{
  int iVar1;
  nni_sock *sock;
  
  sock = nni_dialer_sock(ndialer);
  tlstran_ep_init((tlstran_ep *)arg,sock,tlstran_dial_cb);
  *(nni_dialer **)((long)arg + 0x68) = ndialer;
  if ((*url->u_path != '\0') && (iVar1 = strcmp(url->u_path,"/"), iVar1 != 0)) {
    return 0xf;
  }
  iVar1 = 0xf;
  if ((((url->u_fragment == (char *)0x0) && (url->u_userinfo == (char *)0x0)) &&
      (url->u_query == (char *)0x0)) &&
     (((*url->u_hostname != '\0' && (url->u_port != 0)) &&
      (iVar1 = nng_stream_dialer_alloc_url((nng_stream_dialer **)((long)arg + 0x58),url), iVar1 == 0
      )))) {
    nni_dialer_add_stat(ndialer,(nni_stat_item *)((long)arg + 0x4d0));
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
tlstran_ep_init_dialer(void *arg, nng_url *url, nni_dialer *ndialer)
{
	tlstran_ep *ep = arg;
	int         rv;
	nni_sock   *sock = nni_dialer_sock(ndialer);

	tlstran_ep_init(ep, sock, tlstran_dial_cb);
	ep->ndialer = ndialer;

	// Check for invalid URL components.
	if ((strlen(url->u_path) != 0) && (strcmp(url->u_path, "/") != 0)) {
		return (NNG_EADDRINVAL);
	}
	if ((url->u_fragment != NULL) || (url->u_userinfo != NULL) ||
	    (url->u_query != NULL) || (strlen(url->u_hostname) == 0) ||
	    (url->u_port == 0)) {
		return (NNG_EADDRINVAL);
	}

	if ((rv = nng_stream_dialer_alloc_url(&ep->dialer, url)) != 0) {
		return (rv);
	}
#ifdef NNG_ENABLE_STATS
	nni_dialer_add_stat(ndialer, &ep->st_rcv_max);
#endif
	return (0);
}